

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

JavascriptString *
Js::ScriptFunction::GetComputedName(Var computedNameVar,ScriptContext *scriptContext)

{
  bool bVar1;
  undefined8 local_28;
  JavascriptString *computedName;
  ScriptContext *scriptContext_local;
  Var computedNameVar_local;
  
  if (computedNameVar == (Var)0x0) {
    computedNameVar_local = (Var)0x0;
  }
  else {
    bVar1 = TaggedInt::Is(computedNameVar);
    if (bVar1) {
      local_28 = TaggedInt::ToString(computedNameVar,scriptContext);
    }
    else {
      local_28 = JavascriptConversion::ToString(computedNameVar,scriptContext);
    }
    computedNameVar_local = local_28;
  }
  return (JavascriptString *)computedNameVar_local;
}

Assistant:

JavascriptString* ScriptFunction::GetComputedName(Var computedNameVar, ScriptContext * scriptContext)
    {
        JavascriptString* computedName = nullptr;
        if (computedNameVar != nullptr)
        {
            if (TaggedInt::Is(computedNameVar))
            {
                computedName = TaggedInt::ToString(computedNameVar, scriptContext);
            }
            else
            {
                computedName = JavascriptConversion::ToString(computedNameVar, scriptContext);
            }
            return computedName;
        }
        return nullptr;
    }